

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvodes_diag.c
# Opt level: O1

int CVDiag(void *cvode_mem)

{
  void *__ptr;
  long lVar1;
  int line;
  int iVar2;
  int error_code;
  undefined8 uVar3;
  char *msgfmt;
  
  if (cvode_mem == (void *)0x0) {
    msgfmt = "Integrator memory is NULL.";
    iVar2 = -1;
    cvode_mem = (CVodeMem)0x0;
    error_code = -1;
    line = 0x69;
  }
  else {
    lVar1 = *(long *)(*(long *)((long)cvode_mem + 0x1d0) + 8);
    if ((*(long *)(lVar1 + 0xd0) == 0) || (*(long *)(lVar1 + 0xd8) == 0)) {
      msgfmt = "A required vector operation is not implemented.";
      iVar2 = -3;
      error_code = -3;
      line = 0x72;
    }
    else {
      if (*(code **)((long)cvode_mem + 0x7d8) != (code *)0x0) {
        (**(code **)((long)cvode_mem + 0x7d8))(cvode_mem);
      }
      *(code **)((long)cvode_mem + 0x7c0) = CVDiagInit;
      *(code **)((long)cvode_mem + 0x7c8) = CVDiagSetup;
      *(code **)((long)cvode_mem + 2000) = CVDiagSolve;
      *(code **)((long)cvode_mem + 0x7d8) = CVDiagFree;
      __ptr = malloc(0x30);
      if (__ptr != (void *)0x0) {
        *(undefined8 *)((long)__ptr + 0x28) = 0;
        lVar1 = N_VClone(*(undefined8 *)((long)cvode_mem + 0x1d0));
        *(long *)((long)__ptr + 8) = lVar1;
        if (lVar1 == 0) {
          cvProcessError((CVodeMem)cvode_mem,-4,0x90,"CVDiag",
                         "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/cvodes/cvodes_diag.c"
                         ,"A memory request failed.");
        }
        else {
          lVar1 = N_VClone(*(undefined8 *)((long)cvode_mem + 0x1d0));
          *(long *)((long)__ptr + 0x10) = lVar1;
          if (lVar1 == 0) {
            cvProcessError((CVodeMem)cvode_mem,-4,0x99,"CVDiag",
                           "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/cvodes/cvodes_diag.c"
                           ,"A memory request failed.");
            uVar3 = *(undefined8 *)((long)__ptr + 8);
          }
          else {
            lVar1 = N_VClone(*(undefined8 *)((long)cvode_mem + 0x1d0));
            *(long *)((long)__ptr + 0x18) = lVar1;
            if (lVar1 != 0) {
              *(void **)((long)cvode_mem + 0x7e0) = __ptr;
              return 0;
            }
            cvProcessError((CVodeMem)cvode_mem,-4,0xa3,"CVDiag",
                           "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/cvodes/cvodes_diag.c"
                           ,"A memory request failed.");
            N_VDestroy(*(undefined8 *)((long)__ptr + 8));
            uVar3 = *(undefined8 *)((long)__ptr + 0x10);
          }
          N_VDestroy(uVar3);
        }
        free(__ptr);
        return -4;
      }
      msgfmt = "A memory request failed.";
      iVar2 = -4;
      error_code = -4;
      line = 0x84;
    }
  }
  cvProcessError((CVodeMem)cvode_mem,error_code,line,"CVDiag",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/cvodes/cvodes_diag.c"
                 ,msgfmt);
  return iVar2;
}

Assistant:

int CVDiag(void* cvode_mem)
{
  CVodeMem cv_mem;
  CVDiagMem cvdiag_mem;

  /* Return immediately if cvode_mem is NULL */
  if (cvode_mem == NULL)
  {
    cvProcessError(NULL, CVDIAG_MEM_NULL, __LINE__, __func__, __FILE__,
                   MSGDG_CVMEM_NULL);
    return (CVDIAG_MEM_NULL);
  }
  cv_mem = (CVodeMem)cvode_mem;

  /* Check if N_VCompare and N_VInvTest are present */
  if (vec_tmpl->ops->nvcompare == NULL || vec_tmpl->ops->nvinvtest == NULL)
  {
    cvProcessError(cv_mem, CVDIAG_ILL_INPUT, __LINE__, __func__, __FILE__,
                   MSGDG_BAD_NVECTOR);
    return (CVDIAG_ILL_INPUT);
  }

  if (lfree != NULL) { lfree(cv_mem); }

  /* Set four main function fields in cv_mem */
  linit  = CVDiagInit;
  lsetup = CVDiagSetup;
  lsolve = CVDiagSolve;
  lfree  = CVDiagFree;

  /* Get memory for CVDiagMemRec */
  cvdiag_mem = NULL;
  cvdiag_mem = (CVDiagMem)malloc(sizeof(CVDiagMemRec));
  if (cvdiag_mem == NULL)
  {
    cvProcessError(cv_mem, CVDIAG_MEM_FAIL, __LINE__, __func__, __FILE__,
                   MSGDG_MEM_FAIL);
    return (CVDIAG_MEM_FAIL);
  }

  last_flag = CVDIAG_SUCCESS;

  /* Allocate memory for M, bit, and bitcomp */

  M = N_VClone(vec_tmpl);
  if (M == NULL)
  {
    cvProcessError(cv_mem, CVDIAG_MEM_FAIL, __LINE__, __func__, __FILE__,
                   MSGDG_MEM_FAIL);
    free(cvdiag_mem);
    cvdiag_mem = NULL;
    return (CVDIAG_MEM_FAIL);
  }
  bit = N_VClone(vec_tmpl);
  if (bit == NULL)
  {
    cvProcessError(cv_mem, CVDIAG_MEM_FAIL, __LINE__, __func__, __FILE__,
                   MSGDG_MEM_FAIL);
    N_VDestroy(M);
    free(cvdiag_mem);
    cvdiag_mem = NULL;
    return (CVDIAG_MEM_FAIL);
  }
  bitcomp = N_VClone(vec_tmpl);
  if (bitcomp == NULL)
  {
    cvProcessError(cv_mem, CVDIAG_MEM_FAIL, __LINE__, __func__, __FILE__,
                   MSGDG_MEM_FAIL);
    N_VDestroy(M);
    N_VDestroy(bit);
    free(cvdiag_mem);
    cvdiag_mem = NULL;
    return (CVDIAG_MEM_FAIL);
  }

  /* Attach linear solver memory to integrator memory */
  lmem = cvdiag_mem;

  return (CVDIAG_SUCCESS);
}